

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewClassConstructor(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  Instr *pIVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  DWORD DVar5;
  Opnd *this_01;
  RegOpnd *pRVar6;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  AddrOpnd *opndArg;
  RegOpnd *pRVar9;
  IndirOpnd *pIVar10;
  
  pIVar1 = instr->m_prev;
  this_01 = IR::Instr::UnlinkSrc1(instr);
  pRVar6 = IR::Opnd::AsRegOpnd(this_01);
  pIVar2 = (pRVar6->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,25999,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) goto LAB_00560c12;
    *puVar7 = 0;
  }
  pRVar6 = IR::Opnd::AsRegOpnd(pIVar2->m_src1);
  pRVar8 = IR::Opnd::AsRegOpnd(pIVar2->m_src2);
  pIVar2 = (pRVar8->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6594,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) goto LAB_00560c12;
    *puVar7 = 0;
  }
  opndArg = IR::Opnd::AsAddrOpnd(pIVar2->m_src1);
  pRVar8 = IR::Opnd::AsRegOpnd(pIVar2->m_src2);
  pIVar2 = (pRVar8->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6599,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) goto LAB_00560c12;
    *puVar7 = 0;
  }
  pRVar8 = IR::Opnd::AsRegOpnd(pIVar2->m_src1);
  pRVar9 = IR::Opnd::AsRegOpnd(pIVar2->m_src2);
  pIVar2 = (pRVar9->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x659e,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) {
LAB_00560c12:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,pIVar2->m_src1);
  LowererMD::LoadHelperArgument(this_00,instr,&pRVar8->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,instr,&pRVar6->super_Opnd);
  pRVar6 = IR::Opnd::AsRegOpnd(instr->m_dst);
  pIVar2 = instr->m_next;
  LowererMD::ChangeToHelperCall
            (this_00,instr,HelperScrFunc_OP_NewClassConstructor,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
  DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
  pIVar10 = IR::IndirOpnd::New(pRVar8,DVar5,TyUint64,this->m_func,true);
  InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,pIVar2,false);
  pIVar10 = IR::IndirOpnd::New(pRVar9,0,TyUint64,this->m_func,true);
  InsertMove(&pIVar10->super_Opnd,&pRVar6->super_Opnd,pIVar2,false);
  pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
  DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
  pIVar10 = IR::IndirOpnd::New(pRVar6,DVar5,TyUint64,this->m_func,true);
  InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,pIVar2,false);
  pIVar10 = IR::IndirOpnd::New(pRVar9,0,TyUint64,this->m_func,true);
  InsertMove(&pIVar10->super_Opnd,&pRVar8->super_Opnd,pIVar2,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerNewClassConstructor(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::RegOpnd * opndLink = instr->UnlinkSrc1()->AsRegOpnd();
    IR::Instr * instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::RegOpnd * opndEnvironment = instrDef->GetSrc1()->AsRegOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::AddrOpnd * opndFunctionBodySlot = instrDef->GetSrc1()->AsAddrOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::RegOpnd * opndProto = instrDef->GetSrc1()->AsRegOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::Opnd * opndCtorParent = instrDef->GetSrc1();

    m_lowererMD.LoadHelperArgument(instr, opndCtorParent);
    m_lowererMD.LoadHelperArgument(instr, opndProto);
    m_lowererMD.LoadHelperArgument(instr, opndFunctionBodySlot);
    m_lowererMD.LoadHelperArgument(instr, opndEnvironment);

    IR::RegOpnd * opndConstructor = instr->GetDst()->AsRegOpnd();
    IR::Instr * instrNext = instr->m_next;

    m_lowererMD.ChangeToHelperCall(instr, IR::HelperScrFunc_OP_NewClassConstructor);

    // Put constructor in proto's slot 0

    IR::RegOpnd * opndAuxSlots = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(opndAuxSlots, IR::IndirOpnd::New(opndProto, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func, true), instrNext, false);
    InsertMove(IR::IndirOpnd::New(opndAuxSlots, 0, TyMachPtr, m_func, true), opndConstructor, instrNext, false);

    // Put proto in constructor's slot 0

    opndAuxSlots = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(opndAuxSlots, IR::IndirOpnd::New(opndConstructor, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func, true), instrNext, false);
    InsertMove(IR::IndirOpnd::New(opndAuxSlots, 0, TyMachPtr, m_func, true), opndProto, instrNext, false);

    return instrPrev;
}